

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

void __thiscall
pstd::vector<pbrt::LightHandle,_pstd::pmr::polymorphic_allocator<pbrt::LightHandle>_>::reserve
          (vector<pbrt::LightHandle,_pstd::pmr::polymorphic_allocator<pbrt::LightHandle>_> *this,
          size_t n)

{
  memory_resource *pmVar1;
  LightHandle *pLVar2;
  size_t sVar3;
  int iVar4;
  undefined4 extraout_var;
  size_t sVar6;
  LightHandle *pLVar5;
  
  if (n <= this->nAlloc) {
    return;
  }
  if (n * 8 == 0) {
    pLVar5 = (LightHandle *)0x0;
  }
  else {
    pmVar1 = (this->alloc).memoryResource;
    iVar4 = (*pmVar1->_vptr_memory_resource[2])(pmVar1,n * 8,8);
    pLVar5 = (LightHandle *)CONCAT44(extraout_var,iVar4);
  }
  pLVar2 = this->ptr;
  sVar3 = this->nStored;
  if (sVar3 == 0) {
    if (pLVar2 == (LightHandle *)0x0) goto LAB_003e7a6a;
  }
  else {
    sVar6 = 0;
    do {
      pLVar5[sVar6].
      super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
      .bits = 0;
      pLVar5[sVar6].
      super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
      .bits = pLVar2[sVar6].
              super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
              .bits;
      sVar6 = sVar6 + 1;
    } while (sVar3 != sVar6);
  }
  pmVar1 = (this->alloc).memoryResource;
  (*pmVar1->_vptr_memory_resource[3])(pmVar1,pLVar2,this->nAlloc << 3,8);
LAB_003e7a6a:
  this->nAlloc = n;
  this->ptr = pLVar5;
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }